

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_object.cpp
# Opt level: O1

void __thiscall
mjs::boolean_object::do_debug_print_extra
          (boolean_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  char *pcVar2;
  wchar_t *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = (wchar_t *)local_30;
  std::__cxx11::wstring::_M_construct((ulong)&local_40,indent);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_40,local_38);
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: ");
  pcVar2 = "false";
  if ((this->super_object).field_0x1d != '\0') {
    pcVar2 = "true";
  }
  pwVar1 = std::operator<<(pwVar1,pcVar2);
  std::operator<<(pwVar1,"\n");
  if (local_40 != (wchar_t *)local_30) {
    operator_delete(local_40,local_30[0] * 4 + 4);
  }
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        os << std::wstring(indent, ' ') << "[[Value]]: " << (value_?"true":"false") << "\n";
    }